

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall QMimeXMLProvider::addParent(QMimeXMLProvider *this,QString *child,QString *parent)

{
  parameter_type in_RDX;
  QList<QString> *in_RSI;
  QString *in_RDI;
  
  QHash<QString,_QList<QString>_>::operator[]((QHash<QString,_QList<QString>_> *)parent,in_RDI);
  QList<QString>::append(in_RSI,in_RDX);
  return;
}

Assistant:

void QMimeXMLProvider::addParent(const QString &child, const QString &parent)
{
    m_parents[child].append(parent);
}